

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_create_info.cpp
# Opt level: O1

void __thiscall
duckdb::CreateSequenceInfo::Serialize(CreateSequenceInfo *this,Serializer *serializer)

{
  CreateInfo::Serialize(&this->super_CreateInfo,serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,200,"name",&this->name);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0xc9,"usage_count",&this->usage_count);
  Serializer::WritePropertyWithDefault<long>(serializer,0xca,"increment",&this->increment);
  Serializer::WritePropertyWithDefault<long>(serializer,0xcb,"min_value",&this->min_value);
  Serializer::WritePropertyWithDefault<long>(serializer,0xcc,"max_value",&this->max_value);
  Serializer::WritePropertyWithDefault<long>(serializer,0xcd,"start_value",&this->start_value);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xce,"cycle",&this->cycle);
  return;
}

Assistant:

void CreateSequenceInfo::Serialize(Serializer &serializer) const {
	CreateInfo::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "name", name);
	serializer.WritePropertyWithDefault<uint64_t>(201, "usage_count", usage_count);
	serializer.WritePropertyWithDefault<int64_t>(202, "increment", increment);
	serializer.WritePropertyWithDefault<int64_t>(203, "min_value", min_value);
	serializer.WritePropertyWithDefault<int64_t>(204, "max_value", max_value);
	serializer.WritePropertyWithDefault<int64_t>(205, "start_value", start_value);
	serializer.WritePropertyWithDefault<bool>(206, "cycle", cycle);
}